

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O2

int Ivy_CutTruthPrint(Ivy_Man_t *p,Ivy_Cut_t *pCut,uint uTruth)

{
  int iVar1;
  ushort uVar2;
  ulong uVar3;
  Vec_Ptr_t *vArray;
  Ivy_Obj_t *pObj;
  void *pvVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  uVar2 = pCut->nSize;
  uVar3 = 0;
  if ((short)uVar2 < 1) {
    uVar2 = 0;
  }
  iVar6 = 0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    iVar6 = iVar6 + (uint)(byte)pCut->pArray[uVar3];
  }
  vArray = Vec_PtrAlloc(100);
  lVar7 = 0;
  iVar1 = 0;
  do {
    if (pCut->nSize <= lVar7) {
      iVar5 = 0;
      if (iVar1 < iVar6) {
        iVar5 = (iVar6 - iVar1) * 2;
      }
      return iVar5;
    }
    pObj = Ivy_ManObj(p,pCut->pArray[lVar7] >> 8);
    Ivy_ObjCollectFanouts(p,pObj,vArray);
    iVar5 = 0;
    do {
      if (vArray->nSize <= iVar5) goto LAB_00633c4a;
      pvVar4 = Vec_PtrEntry(vArray,iVar5);
      if (pvVar4 == (void *)0x0) goto LAB_00633c4a;
      iVar5 = iVar5 + 1;
    } while ((*(uint *)((long)pvVar4 + 8) & 0xf) != 4);
    iVar1 = iVar1 + 1;
LAB_00633c4a:
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

int Ivy_CutTruthPrint( Ivy_Man_t * p, Ivy_Cut_t * pCut, unsigned uTruth )
{
    Vec_Ptr_t * vArray;
    Ivy_Obj_t * pObj, * pFanout;
    int nLatches = 0;
    int nPresent = 0;
    int i, k;
    int fVerbose = 0;

    if ( fVerbose )
        printf( "Trying cut : {" );
    for ( i = 0; i < pCut->nSize; i++ )
    {
        if ( fVerbose )
            printf( " %6d(%d)", Ivy_LeafId(pCut->pArray[i]), Ivy_LeafLat(pCut->pArray[i]) );
        nLatches += Ivy_LeafLat(pCut->pArray[i]);
    }
    if ( fVerbose )
        printf( " }   " );
    if ( fVerbose )
        printf( "Latches = %d. ", nLatches );

    // check if there are latches on the fanout edges
    vArray = Vec_PtrAlloc( 100 );
    for ( i = 0; i < pCut->nSize; i++ )
    {
        pObj = Ivy_ManObj( p, Ivy_LeafId(pCut->pArray[i]) );
        Ivy_ObjForEachFanout( p, pObj, vArray, pFanout, k )
        {
            if ( Ivy_ObjIsLatch(pFanout) )
            {
                nPresent++;
                break;
            }
        }
    }
    Vec_PtrSize( vArray );
    if ( fVerbose )
    {
        printf( "Present = %d. ", nPresent );
        if ( nLatches > nPresent )
            printf( "Clauses = %d. ", 2*(nLatches - nPresent) );
        printf( "\n" );
    }
    return ( nLatches > nPresent ) ? 2*(nLatches - nPresent) : 0;
}